

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O0

float basisu::linear_to_srgb(float l)

{
  float in_XMM0_Da;
  float local_4;
  
  if (in_XMM0_Da < 0.0 || 1.0 < in_XMM0_Da) {
    __assert_fail("l >= 0.0f && l <= 1.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                  ,0x254,"float basisu::linear_to_srgb(float)");
  }
  if (0.0031308 <= in_XMM0_Da) {
    powf(in_XMM0_Da,0.41666666);
    local_4 = saturate(0.0);
  }
  else {
    local_4 = saturate(0.0);
  }
  return local_4;
}

Assistant:

float linear_to_srgb(float l)
	{
		assert(l >= 0.0f && l <= 1.0f);
		if (l < .0031308f)
			return saturate(l * 12.92f);
		else
			return saturate(1.055f * powf(l, 1.0f/2.4f) - .055f);
	}